

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QWidgetItemData>::reserve(QList<QWidgetItemData> *this,qsizetype asize)

{
  bool bVar1;
  Int IVar2;
  QArrayDataPointer<QWidgetItemData> *this_00;
  qsizetype qVar3;
  QWidgetItemData *e;
  QWidgetItemData *b;
  Data *pDVar4;
  long in_RSI;
  QArrayDataPointer<QWidgetItemData> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QWidgetItemData> *in_stack_ffffffffffffff78;
  QFlagsStorage<QArrayData::ArrayOption> f;
  QArrayDataPointer<QWidgetItemData> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QWidgetItemData> *in_stack_ffffffffffffff88;
  AllocationOption option;
  QGenericArrayOps<QWidgetItemData> *in_stack_ffffffffffffff90;
  qsizetype local_40;
  QArrayDataPointer<QWidgetItemData> local_38;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_18;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_14;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QArrayDataPointer<QWidgetItemData> *)capacity((QList<QWidgetItemData> *)0x8ae57f);
  qVar3 = QArrayDataPointer<QWidgetItemData>::freeSpaceAtBegin(in_stack_ffffffffffffff88);
  option = (AllocationOption)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (in_RSI <= (long)this_00 - qVar3) {
    QArrayDataPointer<QWidgetItemData>::operator->(in_RDI);
    local_18.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QArrayDataPointer<QWidgetItemData>::flags(in_stack_ffffffffffffff80);
    local_14.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QFlags<QArrayData::ArrayOption>::operator&
                   ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,
                    (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
    if (IVar2 != 0) goto LAB_008ae722;
    QArrayDataPointer<QWidgetItemData>::operator->(in_RDI);
    bVar1 = QArrayDataPointer<QWidgetItemData>::isShared(in_stack_ffffffffffffff80);
    if (!bVar1) {
      QArrayDataPointer<QWidgetItemData>::operator->(in_RDI);
      f.i = (Int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      QFlags<QArrayData::ArrayOption>::QFlags
                ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,f.i);
      QArrayDataPointer<QWidgetItemData>::setFlag
                ((QArrayDataPointer<QWidgetItemData> *)0x8ae626,(ArrayOptions)f.i);
      goto LAB_008ae722;
    }
  }
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QWidgetItemData *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = size((QList<QWidgetItemData> *)in_RDI);
  qMax<long_long>(&local_10,&local_40);
  QArrayDataPointer<QWidgetItemData>::QArrayDataPointer
            (this_00,(qsizetype)in_RDI,(qsizetype)in_stack_ffffffffffffff90,option);
  e = (QWidgetItemData *)QArrayDataPointer<QWidgetItemData>::operator->(&local_38);
  QArrayDataPointer<QWidgetItemData>::operator->(in_RDI);
  b = QArrayDataPointer<QWidgetItemData>::begin((QArrayDataPointer<QWidgetItemData> *)0x8ae6a6);
  QArrayDataPointer<QWidgetItemData>::operator->(in_RDI);
  QArrayDataPointer<QWidgetItemData>::end((QArrayDataPointer<QWidgetItemData> *)e);
  QtPrivate::QGenericArrayOps<QWidgetItemData>::copyAppend(in_stack_ffffffffffffff90,b,e);
  pDVar4 = QArrayDataPointer<QWidgetItemData>::d_ptr(&local_38);
  if (pDVar4 != (Data *)0x0) {
    in_stack_ffffffffffffff78 =
         (QArrayDataPointer<QWidgetItemData> *)
         QArrayDataPointer<QWidgetItemData>::operator->(&local_38);
    QFlags<QArrayData::ArrayOption>::QFlags
              ((QFlags<QArrayData::ArrayOption> *)e,
               (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    QArrayDataPointer<QWidgetItemData>::setFlag
              ((QArrayDataPointer<QWidgetItemData> *)0x8ae709,
               (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)
               SUB84((ulong)in_stack_ffffffffffffff78 >> 0x20,0));
  }
  QArrayDataPointer<QWidgetItemData>::swap
            ((QArrayDataPointer<QWidgetItemData> *)e,in_stack_ffffffffffffff78);
  QArrayDataPointer<QWidgetItemData>::~QArrayDataPointer((QArrayDataPointer<QWidgetItemData> *)e);
LAB_008ae722:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}